

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_4ae09b::TestPresetOutputTruncationHelper
          (optional<cmCTestTypes::TruncationMode> *out,Value *value)

{
  bool bVar1;
  TruncationMode local_b4;
  ValueHolder local_b0;
  String local_a8;
  TruncationMode local_84;
  ValueHolder local_80;
  String local_78;
  TruncationMode local_54;
  ValueHolder local_50;
  String local_48;
  Value *local_20;
  Value *value_local;
  optional<cmCTestTypes::TruncationMode> *out_local;
  
  local_20 = value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    std::optional<cmCTestTypes::TruncationMode>::operator=(out);
    out_local._4_4_ = READ_OK;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_48,local_20);
      bVar1 = std::operator==(&local_48,"tail");
      std::__cxx11::string::~string((string *)&local_48);
      if (bVar1) {
        local_54 = Tail;
        std::optional<cmCTestTypes::TruncationMode>::optional<cmCTestTypes::TruncationMode,_true>
                  ((optional<cmCTestTypes::TruncationMode> *)&local_50,&local_54);
        value_local->value_ = local_50;
        out_local._4_4_ = READ_OK;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_78,local_20);
        bVar1 = std::operator==(&local_78,"middle");
        std::__cxx11::string::~string((string *)&local_78);
        if (bVar1) {
          local_84 = Middle;
          std::optional<cmCTestTypes::TruncationMode>::optional<cmCTestTypes::TruncationMode,_true>
                    ((optional<cmCTestTypes::TruncationMode> *)&local_80,&local_84);
          value_local->value_ = local_80;
          out_local._4_4_ = READ_OK;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_a8,local_20);
          bVar1 = std::operator==(&local_a8,"head");
          std::__cxx11::string::~string((string *)&local_a8);
          if (bVar1) {
            local_b4 = Head;
            std::optional<cmCTestTypes::TruncationMode>::
            optional<cmCTestTypes::TruncationMode,_true>
                      ((optional<cmCTestTypes::TruncationMode> *)&local_b0,&local_b4);
            value_local->value_ = local_b0;
            out_local._4_4_ = READ_OK;
          }
          else {
            out_local._4_4_ = INVALID_PRESET;
          }
        }
      }
    }
    else {
      out_local._4_4_ = INVALID_PRESET;
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult TestPresetOutputTruncationHelper(
  cm::optional<cmCTestTypes::TruncationMode>& out, const Json::Value* value)
{
  if (!value) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "tail") {
    out = cmCTestTypes::TruncationMode::Tail;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "middle") {
    out = cmCTestTypes::TruncationMode::Middle;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "head") {
    out = cmCTestTypes::TruncationMode::Head;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}